

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void CompareOnTheFly(comparer_context *comp)

{
  EVP_PKEY_CTX *ctx;
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  sliced_chunk_iterator local_40;
  comparer_context *local_18;
  
  ctx = (EVP_PKEY_CTX *)&local_18;
  local_18 = comp;
  sliced_chunk_reader::begin(&local_40,(sliced_chunk_reader *)ctx);
  do {
    if (local_40.endit != false) {
LAB_002de4bc:
      fseek((FILE *)(local_40.ctx)->actual,local_40.end,0);
      fseek((FILE *)(local_40.ctx)->expect,local_40.end,0);
      return;
    }
    if (local_40.current.first == 0x1239) {
      CompareOnTheFlyScene(comp);
      goto LAB_002de4bc;
    }
    sliced_chunk_iterator::cleanup(&local_40,ctx);
    sliced_chunk_iterator::load_next(&local_40);
  } while( true );
}

Assistant:

void CompareOnTheFly(comparer_context& comp)
{
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AISCENE) {
            CompareOnTheFlyScene(comp);
            break;
        }
    }
}